

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::CostAttributes::changeSelector
          (CostAttributes *this,MatrixDynSize *inputSelector)

{
  PointerType pdVar1;
  variable_if_dynamic<long,__1> vVar2;
  variable_if_dynamic<long,__1> vVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  MatrixSelector *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_148;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_128;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_108;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_e8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_0>
  local_c8;
  
  uVar6 = iDynTree::MatrixDynSize::rows();
  uVar4 = iDynTree::VectorDynSize::size();
  if (uVar6 == uVar4) {
    lVar7 = iDynTree::MatrixDynSize::cols();
    (*((this->selector).
       super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_Selector[3])();
    lVar8 = iDynTree::MatrixDynSize::cols();
    if (lVar7 == lVar8) {
      this_00 = (MatrixSelector *)operator_new(0xb8);
      MatrixSelector::MatrixSelector(this_00,inputSelector);
      std::__shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>::
      reset<iDynTree::optimalcontrol::MatrixSelector>
                (&(this->selector).
                  super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>
                 ,this_00);
      iVar5 = (*((this->selector).
                 super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Selector[3])();
      toEigen((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
              &local_108,(MatrixDynSize *)CONCAT44(extraout_var,iVar5));
      vVar3.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      vVar2.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      pdVar1 = local_108.
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data;
      toEigen(&local_128,&this->weightMatrix);
      toEigen(&local_148,&this->weightMatrix);
      local_c8.m_lhs.m_lhs.m_rows.m_value = vVar3.m_value;
      local_c8.m_lhs.m_lhs.m_cols.m_value = vVar2.m_value;
      local_c8.m_lhs.m_lhs.m_functor.m_other = 0.5;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = pdVar1;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = vVar2.m_value;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value = vVar3.m_value;
      local_c8.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_128.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c8.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_128.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_rhs.m_lhs.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_128.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_c8.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_148.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c8.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_rhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_148.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      toEigen(&local_e8,&this->gradientSubMatrix);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>const>,0>>
                (&local_e8,&local_c8);
      toEigen(&local_108,&this->gradientSubMatrix);
      iVar5 = (*((this->selector).
                 super___shared_ptr<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Selector[3])();
      toEigen((Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
              &local_128,(MatrixDynSize *)CONCAT44(extraout_var_00,iVar5));
      local_c8.m_lhs.m_lhs.m_cols.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_c8.m_lhs._0_8_ =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_data;
      local_c8.m_lhs.m_lhs.m_rows.m_value =
           local_108.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_128.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_128.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_c8.m_lhs.m_rhs.m_matrix.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_128.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      toEigen(&local_148,&this->hessianMatrix);
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>,0>>
                (&local_148,
                 (Product<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)&local_c8);
      return true;
    }
  }
  iDynTree::reportError
            ("L2NormCost","getObject","The new selector dimensionsions do not match the old one.");
  return false;
}

Assistant:

bool changeSelector(const MatrixDynSize& inputSelector) {
                if ((inputSelector.rows() != this->selector->size()) || (inputSelector.cols() != this->selector->asSelectorMatrix().cols())) {
                    reportError("L2NormCost", "getObject", "The new selector dimensionsions do not match the old one.");
                    return false;
                }
                this->selector.reset(new MatrixSelector(inputSelector));
                toEigen(this->gradientSubMatrix) = 0.5 * toEigen(this->selector->asSelectorMatrix()).transpose() * (toEigen(this->weightMatrix) + toEigen(this->weightMatrix).transpose());
                toEigen(this->hessianMatrix) = toEigen(this->gradientSubMatrix) * toEigen(this->selector->asSelectorMatrix());

                return true;
            }